

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_string.c
# Opt level: O1

int lj_cf_string_format(lua_State *L)

{
  SBuf *sb;
  TValue *pTVar1;
  TValue *pTVar2;
  cTValue *pcVar3;
  TValue *pTVar4;
  SFormat sf;
  int32_t c;
  GCstr *pGVar5;
  void *v;
  cTValue *pcVar6;
  ulong uVar7;
  int iVar8;
  long lVar9;
  int narg;
  int iVar10;
  int iVar11;
  cTValue *o;
  lua_Number lVar12;
  FormatState fs;
  int local_58;
  FormatState local_50;
  
  pTVar1 = L->top;
  pTVar2 = L->base;
  iVar11 = 0;
  do {
    uVar7 = (ulong)(L->glref).ptr32;
    sb = (SBuf *)(uVar7 + 0xe8);
    *(int *)(uVar7 + 0xf4) = (int)L;
    *(undefined4 *)(uVar7 + 0xe8) = *(undefined4 *)(uVar7 + 0xf0);
    pGVar5 = lj_lib_checkstr(L,1);
    local_50.p = (uint8_t *)(pGVar5 + 1);
    local_50.e = (uint8_t *)((long)&pGVar5[1].nextgc.gcptr32 + (ulong)pGVar5->len);
    iVar8 = 1;
    while( true ) {
      while (iVar10 = iVar11, sf = lj_strfmt_parse(&local_50), iVar11 = iVar10, sf == 2) {
        lj_buf_putmem(sb,local_50.str,local_50.len);
      }
      if (sf == 0) break;
      if (sf == 1) {
        pGVar5 = lj_str_new(L,local_50.str,(ulong)local_50.len);
        lj_err_callerv(L,LJ_ERR_STRFMT,pGVar5 + 1);
      }
      narg = iVar8 + 1;
      local_58 = (int)((ulong)((long)pTVar1 - (long)pTVar2) >> 3);
      if (local_58 <= iVar8) {
        luaL_argerror(L,narg,"no value");
      }
      iVar8 = narg;
      switch(sf & 0xf) {
      case 3:
        lVar12 = lj_lib_checknum(L,narg);
        lj_strfmt_putfnum_int(sb,sf,lVar12);
        break;
      case 4:
        lVar12 = lj_lib_checknum(L,narg);
        lj_strfmt_putfnum_uint(sb,sf,lVar12);
        break;
      case 5:
        lVar12 = lj_lib_checknum(L,narg);
        lj_strfmt_putfnum(sb,sf,lVar12);
        break;
      case 6:
        lVar9 = (long)narg;
        o = L->base + lVar9 + -1;
        if (*(int *)((long)L->base + lVar9 * 8 + -4) == -5) {
          pGVar5 = (GCstr *)(ulong)(o->u32).lo;
        }
        else if ((iVar10 == 2) ||
                (pcVar6 = lj_meta_lookup(L,o,MM_tostring), (pcVar6->field_2).it == 0xffffffff)) {
          pGVar5 = lj_strfmt_obj(L,o);
        }
        else {
          pcVar3 = L->top;
          L->top = pcVar3 + 1;
          *pcVar3 = *pcVar6;
          pTVar4 = L->top;
          L->top = pTVar4 + 1;
          *pTVar4 = *o;
          lua_call(L,1,1);
          pTVar4 = L->top;
          L->top = pTVar4 + -1;
          L->base[lVar9 + -1] = pTVar4[-1];
          pGVar5 = (GCstr *)0x0;
        }
        iVar11 = 1;
        if (pGVar5 != (GCstr *)0x0) {
          if ((sf & 0x10) == 0) {
            lj_strfmt_putfstr(sb,sf,pGVar5);
            iVar11 = iVar10;
          }
          else {
            lj_strfmt_putquoted(sb,pGVar5);
            iVar11 = iVar10;
          }
        }
        break;
      case 7:
        c = lj_lib_checkint(L,narg);
        lj_strfmt_putfchar(sb,sf,c);
        break;
      case 8:
        v = lj_obj_ptr((global_State *)(ulong)(L->glref).ptr32,L->base + (long)narg + -1);
        lj_strfmt_putptr(sb,v);
      }
    }
    iVar11 = iVar10 + 1;
  } while (iVar10 == 1);
  pTVar1 = L->top;
  pGVar5 = lj_str_new(L,(char *)(ulong)*(uint *)(uVar7 + 0xf0),
                      (ulong)(*(int *)(uVar7 + 0xe8) - *(uint *)(uVar7 + 0xf0)));
  pTVar1[-1].u32.lo = (uint32_t)pGVar5;
  *(undefined4 *)((long)pTVar1 + -4) = 0xfffffffb;
  uVar7 = (ulong)(L->glref).ptr32;
  if (*(uint *)(uVar7 + 0x54) <= *(uint *)(uVar7 + 0x50)) {
    lj_gc_step(L);
  }
  return 1;
}

Assistant:

LJLIB_CF(string_format)		LJLIB_REC(.)
{
  int arg, top = (int)(L->top - L->base);
  GCstr *fmt;
  SBuf *sb;
  FormatState fs;
  SFormat sf;
  int retry = 0;
again:
  arg = 1;
  sb = lj_buf_tmp_(L);
  fmt = lj_lib_checkstr(L, arg);
  lj_strfmt_init(&fs, strdata(fmt), fmt->len);
  while ((sf = lj_strfmt_parse(&fs)) != STRFMT_EOF) {
    if (sf == STRFMT_LIT) {
      lj_buf_putmem(sb, fs.str, fs.len);
    } else if (sf == STRFMT_ERR) {
      lj_err_callerv(L, LJ_ERR_STRFMT, strdata(lj_str_new(L, fs.str, fs.len)));
    } else {
      if (++arg > top)
	luaL_argerror(L, arg, lj_obj_typename[0]);
      switch (STRFMT_TYPE(sf)) {
      case STRFMT_INT:
	if (tvisint(L->base+arg-1)) {
	  int32_t k = intV(L->base+arg-1);
	  if (sf == STRFMT_INT)
	    lj_strfmt_putint(sb, k);  /* Shortcut for plain %d. */
	  else
	    lj_strfmt_putfxint(sb, sf, k);
	} else {
	  lj_strfmt_putfnum_int(sb, sf, lj_lib_checknum(L, arg));
	}
	break;
      case STRFMT_UINT:
	if (tvisint(L->base+arg-1))
	  lj_strfmt_putfxint(sb, sf, intV(L->base+arg-1));
	else
	  lj_strfmt_putfnum_uint(sb, sf, lj_lib_checknum(L, arg));
	break;
      case STRFMT_NUM:
	lj_strfmt_putfnum(sb, sf, lj_lib_checknum(L, arg));
	break;
      case STRFMT_STR: {
	GCstr *str = string_fmt_tostring(L, arg, retry);
	if (str == NULL)
	  retry = 1;
	else if ((sf & STRFMT_T_QUOTED))
	  lj_strfmt_putquoted(sb, str);  /* No formatting. */
	else
	  lj_strfmt_putfstr(sb, sf, str);
	break;
	}
      case STRFMT_CHAR:
	lj_strfmt_putfchar(sb, sf, lj_lib_checkint(L, arg));
	break;
      case STRFMT_PTR:  /* No formatting. */
	lj_strfmt_putptr(sb, lj_obj_ptr(G(L), L->base+arg-1));
	break;
      default:
	lj_assertL(0, "bad string format type");
	break;
      }
    }
  }
  if (retry++ == 1) goto again;
  setstrV(L, L->top-1, lj_buf_str(L, sb));
  lj_gc_check(L);
  return 1;
}